

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary,bool verbose)

{
  uint uVar1;
  Node *pNVar2;
  bool bVar3;
  uint32_t uVar4;
  invalid_argument *this_00;
  reference pvVar5;
  reference ppNVar6;
  size_type sVar7;
  reference ppNVar8;
  uint local_c4;
  uint32_t j;
  uint uStack_b8;
  bool is_gap;
  uint32_t column;
  uint32_t p;
  uint32_t c;
  Node *it_1;
  undefined1 local_a0 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  Node **jt;
  iterator __end3;
  iterator __begin3;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range3;
  reference local_58;
  Node **it;
  iterator __end2;
  iterator __begin2;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range2;
  bool verbose_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *summary_local;
  Graph *this_local;
  string *dst;
  
  if (summary == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(summary);
  if (!verbose) {
    __end2 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                       (&this->consensus_);
    it = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                            (&this->consensus_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                       *)&it), bVar3) {
      local_58 = __gnu_cxx::
                 __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                 ::operator*(&__end2);
      __range3._4_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                (summary,(int *)((long)&__range3 + 4));
      uVar4 = Node::Coverage(*local_58);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(summary);
      *pvVar5 = uVar4 + *pvVar5;
      pNVar2 = *local_58;
      __end3 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                         (&pNVar2->aligned_nodes);
      jt = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                              (&pNVar2->aligned_nodes);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                         *)&jt), bVar3) {
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                  ::operator*(&__end3);
        uVar4 = Node::Coverage(*ppNVar6);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(summary);
        *pvVar5 = uVar4 + *pvVar5;
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
      ::operator++(&__end2);
    }
    return __return_storage_ptr__;
  }
  uVar4 = this->num_codes_;
  sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                    (&this->consensus_);
  node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (summary,(uVar4 + 1) * sVar7,
             (value_type_conflict2 *)
             ((long)&node_id_to_column.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  InitializeMultipleSequenceAlignment
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,this,(uint32_t *)0x0);
  it_1._4_4_ = 0;
LAB_00121093:
  sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                    (&this->sequences_);
  if (sVar7 <= it_1._4_4_) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
    return __return_storage_ptr__;
  }
  ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                      (&this->sequences_,(ulong)it_1._4_4_);
  _p = *ppNVar8;
  column = 0;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,(ulong)_p->id)
  ;
  j = *pvVar5;
  bVar3 = false;
  do {
    for (; sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                             (&this->consensus_), column < sVar7; column = column + 1) {
      ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                          (&this->consensus_,(ulong)column);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                          (ulong)(*ppNVar8)->id);
      if (j <= *pvVar5) {
        ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                            (&this->consensus_,(ulong)column);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                            (ulong)(*ppNVar8)->id);
        if (*pvVar5 == j) {
          local_c4 = uStack_b8;
          if (bVar3) {
            while (local_c4 = local_c4 + 1, local_c4 < column) {
              uVar1 = this->num_codes_;
              sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                                (&this->consensus_);
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (summary,uVar1 * sVar7 + (ulong)local_c4);
              *pvVar5 = *pvVar5 + 1;
            }
          }
          bVar3 = true;
          uStack_b8 = column;
          uVar1 = _p->code;
          sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                            (&this->consensus_);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (summary,uVar1 * sVar7 + (ulong)column);
          *pvVar5 = *pvVar5 + 1;
        }
        break;
      }
    }
    sVar7 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                      (&this->consensus_);
    if ((column == sVar7) || (_p = Node::Successor(_p,it_1._4_4_), _p == (Node *)0x0)) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                        (ulong)_p->id);
    j = *pvVar5;
  } while( true );
  it_1._4_4_ = it_1._4_4_ + 1;
  goto LAB_00121093;
}

Assistant:

std::string Graph::GenerateConsensus(
    std::vector<std::uint32_t>* summary,
    bool verbose) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }

  auto dst = GenerateConsensus();

  summary->clear();
  if (!verbose) {
    for (const auto& it : consensus_) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto& jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  } else {
    summary->resize((num_codes_ + 1) * consensus_.size(), 0);
    auto node_id_to_column = InitializeMultipleSequenceAlignment();

    for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
      Node* it = sequences_[i];
      std::uint32_t c = 0, p, column = node_id_to_column[it->id];
      bool is_gap = false;
      while (true) {
        for (; c < consensus_.size(); ++c) {
          if (node_id_to_column[consensus_[c]->id] < column) {
            continue;
          } else {
            if (node_id_to_column[consensus_[c]->id] == column) {
              if (is_gap) {
                for (std::uint32_t j = p + 1; j < c; ++j) {
                  ++(*summary)[num_codes_ * consensus_.size() + j];
                }
              }
              is_gap = true;
              p = c;
              ++(*summary)[it->code * consensus_.size() + c];
            }
            break;
          }
        }
        if (c == consensus_.size() || !(it = it->Successor(i))) {
          break;
        }
        column = node_id_to_column[it->id];
      }
    }
  }

  return dst;
}